

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O1

void __thiscall OpenMD::GBtailVisitor::GBtailVisitor(GBtailVisitor *this,SimInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_58;
  Vector3d local_38;
  
  ReplacementVisitor::ReplacementVisitor(&this->super_ReplacementVisitor,info);
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_002ba0f0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                     visitorName,0,
             (char *)(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                     visitorName._M_string_length,0x25b186);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GBtail","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"C","");
  local_38.super_Vector<double,_3U>.data_[0] = 0.0;
  local_38.super_Vector<double,_3U>.data_[1] = 0.0;
  local_38.super_Vector<double,_3U>.data_[2] = 9.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"C","");
  local_38.super_Vector<double,_3U>.data_[0] = 0.0;
  local_38.super_Vector<double,_3U>.data_[1] = 0.0;
  local_38.super_Vector<double,_3U>.data_[2] = 0.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"C","");
  local_38.super_Vector<double,_3U>.data_[0] = 0.0;
  local_38.super_Vector<double,_3U>.data_[1] = 0.0;
  local_38.super_Vector<double,_3U>.data_[2] = -9.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

GBtailVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBtailVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBtail");

      // this is the reference structure we'll use for the replacement:
      addSite("C", Vector3d(0.0, 0.0, 9.0));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("C", Vector3d(0.0, 0.0, -9.0));
    }